

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMinLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  ArgMinLayerParams *pAVar3;
  Tensor *this_00;
  int64_t iVar4;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string err;
  int rank;
  ArgMinLayerParams *params;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar1;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 == 0) {
      pAVar3 = Specification::NeuralNetworkLayer::argmin(local_20);
      bVar1 = Specification::ArgMinLayerParams::removedim(pAVar3);
      layer_00 = local_20;
      if (!bVar1) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"ArgMin",(allocator<char> *)((long)&params + 7));
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer_00,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar1;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(local_20);
      if (0 < iVar2) {
        pAVar3 = Specification::NeuralNetworkLayer::argmin(local_20);
        this_00 = Specification::NeuralNetworkLayer::inputtensor(local_20,0);
        err.field_2._12_4_ = Specification::Tensor::rank(this_00);
        iVar4 = Specification::ArgMinLayerParams::axis(pAVar3);
        if ((iVar4 < (int)-err.field_2._12_4_) ||
           (iVar4 = Specification::ArgMinLayerParams::axis(pAVar3), (int)err.field_2._12_4_ <= iVar4
           )) {
          __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+(&local_b8,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         __rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,&local_b8,"\' layer.");
          std::__cxx11::string::~string((string *)&local_b8);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
          local_38 = 1;
          std::__cxx11::string::~string((string *)local_98);
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMinLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    if (!layer.argmin().removedim()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ArgMin", blobNameToRank));
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmin();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}